

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O0

void intgemm::TestMultiplyBiasRelu<intgemm::SSE2::Kernels16>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  anon_class_16_2_a84000ed callback;
  UnquantizeAndAddBiasAndWriteRelu callback_00;
  float unquant_mult_00;
  ostream *poVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  anon_class_8_1_8989cfb7 callback_01;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  result_type_conflict rVar5;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<short> B_quant;
  AlignedVector<float> test_C;
  AlignedVector<short> B_prep;
  AlignedVector<short> A_prep;
  float unquant_mult;
  float quant_mult;
  float *it_2;
  float *__end2_2;
  float *__begin2_2;
  AlignedVector<float> *__range2_2;
  float *it_1;
  float *__end2_1;
  float *__begin2_1;
  AlignedVector<float> *__range2_1;
  float *it;
  float *__end2;
  float *__begin2;
  AlignedVector<float> *__range2;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<float> A;
  ostringstream info;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe878;
  Index cols;
  uniform_real_distribution<float> *in_stack_ffffffffffffe880;
  AlignedVector<float> *pAVar6;
  int16_t *in_stack_ffffffffffffe888;
  AlignedVector<float> *in_stack_ffffffffffffe890;
  int16_t *in_stack_ffffffffffffe898;
  float *in_stack_ffffffffffffe8a0;
  Index IVar8;
  AlignedVector<float> *pAVar7;
  undefined8 in_stack_ffffffffffffe8a8;
  float *in_stack_ffffffffffffe8b0;
  short *in_stack_ffffffffffffe8b8;
  short *in_stack_ffffffffffffe8c0;
  int16_t *in_stack_ffffffffffffe8c8;
  float *in_stack_ffffffffffffe8d0;
  string local_1680 [32];
  AlignedVector<float> *local_1660;
  AlignedVector<float> local_1658;
  float *local_1648;
  AlignedVector<float> *pAStack_1640;
  AlignedVector<float> local_1638;
  AlignedVector<short> local_1628;
  UnquantizeAndAddBiasAndWriteRelu local_1618;
  AlignedVector<float> local_1600;
  AlignedVector<short> local_15f0;
  AlignedVector<short> local_15e0;
  float local_15d0 [2];
  float *local_15c8;
  float *local_15c0;
  float *local_15b8;
  AlignedVector<float> *local_15b0;
  float *local_15a8;
  float *local_15a0;
  float *in_stack_ffffffffffffea78;
  float *local_1578;
  undefined1 in_stack_ffffffffffffea98 [16];
  float in_stack_fffffffffffff060;
  float in_stack_fffffffffffff064;
  float in_stack_fffffffffffff068;
  float in_stack_fffffffffffff06c;
  string *in_stack_fffffffffffff070;
  size_t in_stack_fffffffffffff078;
  float *in_stack_fffffffffffff080;
  float *in_stack_fffffffffffff088;
  float *in_stack_fffffffffffff090;
  AlignedVector<float> local_1d8;
  AlignedVector<float> local_1c8;
  AlignedVector<float> local_1b8 [2];
  ostringstream local_198 [396];
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"16-bit SSE2");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::operator<<(poVar1,'\n');
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             (size_t)in_stack_ffffffffffffe880);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             (size_t)in_stack_ffffffffffffe880);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             (size_t)in_stack_ffffffffffffe880);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x21b19f);
  std::uniform_real_distribution<float>::uniform_real_distribution
            (in_stack_ffffffffffffe880,(float)((ulong)in_stack_ffffffffffffe878 >> 0x20),
             SUB84(in_stack_ffffffffffffe878,0));
  pAVar7 = local_1b8;
  local_1578 = AlignedVector<float>::begin(pAVar7);
  pfVar2 = AlignedVector<float>::end(pAVar7);
  for (; local_1578 != pfVar2; local_1578 = local_1578 + 1) {
    in_stack_ffffffffffffea78 = local_1578;
    rVar5 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffe880,in_stack_ffffffffffffe878);
    *in_stack_ffffffffffffea78 = rVar5;
  }
  pAVar6 = &local_1c8;
  pfVar3 = AlignedVector<float>::begin(pAVar6);
  local_15a0 = AlignedVector<float>::end(pAVar6);
  for (; pfVar3 != local_15a0; pfVar3 = pfVar3 + 1) {
    local_15a8 = pfVar3;
    rVar5 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffe880,in_stack_ffffffffffffe878);
    *local_15a8 = rVar5;
  }
  local_15b0 = &local_1d8;
  local_15b8 = AlignedVector<float>::begin(local_15b0);
  local_15c0 = AlignedVector<float>::end(local_15b0);
  for (; IVar8 = (Index)((ulong)pfVar3 >> 0x20), local_15b8 != local_15c0;
      local_15b8 = local_15b8 + 1) {
    local_15c8 = local_15b8;
    rVar5 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffe880,in_stack_ffffffffffffe878);
    *local_15c8 = rVar5;
  }
  local_15d0[1] = 1024.0;
  local_15d0[0] = 9.536743e-07;
  AlignedVector<float>::size(local_1b8);
  cols = (Index)((ulong)in_stack_ffffffffffffe878 >> 0x20);
  AlignedVector<short>::AlignedVector
            ((AlignedVector<short> *)in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             (size_t)in_stack_ffffffffffffe880);
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<short>::AlignedVector
            ((AlignedVector<short> *)in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             (size_t)in_stack_ffffffffffffe880);
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<short>::begin(&local_15e0);
  SSE2::Kernels16::PrepareA
            ((float *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888,
             (float)((ulong)in_stack_ffffffffffffe880 >> 0x20),(Index)in_stack_ffffffffffffe880,cols
            );
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<short>::begin(&local_15f0);
  SSE2::Kernels16::PrepareB
            (in_stack_ffffffffffffe8d0,in_stack_ffffffffffffe8c8,
             (float)((ulong)in_stack_ffffffffffffe8c0 >> 0x20),(Index)in_stack_ffffffffffffe8c0,
             (Index)((ulong)in_stack_ffffffffffffe8b8 >> 0x20));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)in_stack_ffffffffffffe888,
             (size_t)in_stack_ffffffffffffe880);
  AlignedVector<short>::begin(&local_15e0);
  AlignedVector<short>::begin(&local_15f0);
  unquant_mult_00 = local_15d0[0];
  pfVar3 = AlignedVector<float>::begin(&local_1d8);
  pfVar4 = AlignedVector<float>::begin(&local_1600);
  callbacks::UnquantizeAndAddBiasAndWriteRelu::UnquantizeAndAddBiasAndWriteRelu
            (&local_1618,unquant_mult_00,pfVar3,pfVar4);
  callback_00.bias_addr = (float *)in_stack_ffffffffffffea98._0_8_;
  callback_00.output_addr = (float *)in_stack_ffffffffffffea98._8_8_;
  callback_00._0_8_ = pAVar7;
  SSE2::Kernels16::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>
            ((int16_t *)pfVar2,(int16_t *)in_stack_ffffffffffffea78,(Index)((ulong)pAVar6 >> 0x20),
             (Index)pAVar6,IVar8,callback_00);
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<short>::AlignedVector
            ((AlignedVector<short> *)in_stack_ffffffffffffe890,(size_t)local_1618.output_addr,
             (size_t)local_1618.bias_addr);
  pAVar7 = &local_1c8;
  AlignedVector<float>::begin(pAVar7);
  AlignedVector<short>::begin(&local_1628);
  AlignedVector<float>::size(pAVar7);
  SSE2::Kernels16::Quantize
            (in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898,
             (float)((ulong)in_stack_ffffffffffffe890 >> 0x20),(Index)in_stack_ffffffffffffe890);
  IVar8 = (Index)((ulong)in_stack_ffffffffffffe8a0 >> 0x20);
  AlignedVector<float>::size(&local_1600);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)local_1618.output_addr,(size_t)local_1618.bias_addr);
  pfVar2 = (float *)AlignedVector<short>::begin(&local_15e0);
  callback_01.bias = (AlignedVector<float> *)AlignedVector<short>::begin(&local_1628);
  AlignedVector<float>::begin(&local_1638);
  local_1648 = local_15d0;
  pAVar6 = &local_1d8;
  callback.bias = pAVar7;
  callback.unquant_mult = (float *)callback_01.bias;
  pAStack_1640 = pAVar6;
  references::
  Multiply<short,_short,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:460:99),_nullptr>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,in_stack_ffffffffffffe8b0,
             (Index)((ulong)in_stack_ffffffffffffe8a8 >> 0x20),(Index)in_stack_ffffffffffffe8a8,
             IVar8,callback);
  IVar8 = (Index)((ulong)in_stack_ffffffffffffe8a8 >> 0x20);
  AlignedVector<float>::size(&local_1600);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe890,(size_t)local_1618.output_addr,(size_t)pAVar6);
  pfVar3 = AlignedVector<float>::begin(local_1b8);
  pfVar4 = AlignedVector<float>::begin(&local_1c8);
  AlignedVector<float>::begin(&local_1658);
  local_1660 = &local_1d8;
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:465:86),_nullptr>
            (pfVar2,pfVar4,pfVar3,(Index)((ulong)in_stack_ffffffffffffe8b0 >> 0x20),
             (Index)in_stack_ffffffffffffe8b0,IVar8,callback_01);
  AlignedVector<float>::begin(&local_1658);
  AlignedVector<float>::begin(&local_1638);
  pAVar7 = &local_1600;
  AlignedVector<float>::begin(pAVar7);
  AlignedVector<float>::size(pAVar7);
  std::__cxx11::ostringstream::str();
  CompareMSE(in_stack_fffffffffffff090,in_stack_fffffffffffff088,in_stack_fffffffffffff080,
             in_stack_fffffffffffff078,in_stack_fffffffffffff070,in_stack_fffffffffffff06c,
             in_stack_fffffffffffff068,in_stack_fffffffffffff064,in_stack_fffffffffffff060);
  std::__cxx11::string::~string(local_1680);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21b8ce);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21b8db);
  AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x21b8e8);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21b8f5);
  AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x21b902);
  AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x21b90f);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21b91c);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21b929);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21b936);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void TestMultiplyBiasRelu(Index A_rows, Index width, Index B_cols,
 float int_tolerance = 0.1f, float float_tolerance = 1.0f, float MSE_float_tolerance = 0.0f, float MSE_int_tolerance = 0.0f) {
  using Integer = typename Routine::Integer;
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float quant_mult = (sizeof(Integer) == 2) ? 1024 : 64;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<Integer> A_prep(A.size());
  AlignedVector<Integer> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  Routine::Multiply(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWriteRelu(unquant_mult, bias.begin(), test_C.begin()));

  AlignedVector<Integer> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Assuming A is just quantization here.
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return std::max(0.0f, sum * unquant_mult + bias[info.col_idx]);
  });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return std::max(0.0f, static_cast<float>(sum) + bias[info.col_idx]);
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}